

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O0

void __thiscall
FragmentTest_MakeReadOnlySection_Test::TestBody(FragmentTest_MakeReadOnlySection_Test *this)

{
  allocator<pstore::repo::section_kind> *paVar1;
  fragment *this_00;
  cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
  __first;
  cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
  __last;
  initializer_list<pstore::repo::section_kind> __l;
  initializer_list<unsigned_char> ilist;
  bool bVar2;
  iterator begin;
  iterator end;
  storage_type *psVar3;
  pointer ppVar4;
  char *pcVar5;
  member_array *this_01;
  iterator __last_00;
  iterator __first_00;
  vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>_>_>
  *matcher;
  char *in_R9;
  extent<pstore::repo::fragment> eVar6;
  AssertHelper local_450;
  Message local_448;
  void *local_440;
  type *local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_8;
  Message local_418;
  container<pstore::repo::external_fixup> local_410;
  size_type local_400;
  uint local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_7;
  Message local_3d8;
  container<pstore::repo::internal_fixup> local_3d0;
  size_type local_3c0;
  uint local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_6;
  Message local_398;
  uint local_390 [2];
  undefined1 local_388 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_358;
  Message local_350;
  pointer local_348;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_;
  Message local_320;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  pointer local_310;
  difference_type local_308;
  difference_type local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_4;
  iterator rodata_end;
  iterator rodata_begin;
  iterator data_end;
  iterator local_2b0;
  iterator data_begin;
  Message local_2a0;
  uint64_t local_298;
  uint local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_3;
  Message local_270;
  uint local_268 [2];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_2;
  generic_section *s;
  Message local_240;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>_>_>
  local_238;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>_>_>_>
  local_220;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_1;
  iterator local_1f0;
  iterator local_1d8;
  undefined1 local_1c0 [8];
  vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> actual;
  indices indices;
  undefined1 local_190 [8];
  vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> expected;
  fragment *f;
  AssertHelper local_160;
  Message local_158;
  uchar *local_150;
  _Rb_tree_const_iterator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>
  local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  extent<pstore::repo::fragment> extent;
  uchar local_10e [6];
  iterator local_108;
  undefined8 local_100;
  reference local_f8;
  section_content *rodata;
  array<pstore::repo::section_content,_1UL> c;
  FragmentTest_MakeReadOnlySection_Test *this_local;
  
  c._M_elems[0].xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  pstore::repo::section_content::section_content((section_content *)&rodata,read_only,'\x04');
  local_f8 = std::array<pstore::repo::section_content,_1UL>::back
                       ((array<pstore::repo::section_content,_1UL> *)&rodata);
  builtin_memcpy(local_10e,"rodata",6);
  local_108 = local_10e;
  local_100 = 6;
  ilist._M_len = 6;
  ilist._M_array = local_108;
  pstore::small_vector<unsigned_char,_128UL>::assign(&local_f8->data,ilist);
  begin = std::begin<std::array<pstore::repo::section_content,1ul>>
                    ((array<pstore::repo::section_content,_1UL> *)&rodata);
  end = std::end<std::array<pstore::repo::section_content,1ul>>
                  ((array<pstore::repo::section_content,_1UL> *)&rodata);
  eVar6 = (anonymous_namespace)::build_fragment<pstore::repo::section_content*>
                    (&(this->super_FragmentTest).transaction_,begin,end);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )eVar6.addr.a_.a_;
  psVar3 = ::transaction::get_storage(&(this->super_FragmentTest).transaction_);
  local_148._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char_*,_std::shared_ptr<unsigned_char>,_std::less<unsigned_char_*>,_std::allocator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>_>
       ::begin(psVar3);
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>
           ::operator->(&local_148);
  local_150 = (uchar *)pstore::typed_address<pstore::repo::fragment>::absolute
                                 ((typed_address<pstore::repo::fragment> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_char_*,_const_unsigned_char_*,_nullptr>
            ((EqHelper *)local_140,"transaction_.get_storage ().begin ()->first",
             "reinterpret_cast<std::uint8_t const *> (extent.addr.absolute ())",&ppVar4->first,
             &local_150);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
               ,0x6c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  if (bVar2) {
    psVar3 = ::transaction::get_storage(&(this->super_FragmentTest).transaction_);
    expected.
    super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<unsigned_char_*,_std::shared_ptr<unsigned_char>,_std::less<unsigned_char_*>,_std::allocator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>_>
                  ::begin(psVar3);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<unsigned_char_*const,_std::shared_ptr<unsigned_char>_>_>
                           *)&expected.
                              super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = (fragment *)ppVar4->first;
    actual.
    super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0xb;
    paVar1 = (allocator<pstore::repo::section_kind> *)
             ((long)&actual.
                     super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
    std::allocator<pstore::repo::section_kind>::allocator(paVar1);
    __l._M_len = 1;
    __l._M_array = (iterator)
                   ((long)&actual.
                           super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>::vector
              ((vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> *)
               local_190,__l,paVar1);
    std::allocator<pstore::repo::section_kind>::~allocator
              ((allocator<pstore::repo::section_kind> *)
               ((long)&actual.
                       super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    this_01 = pstore::repo::fragment::members(this_00);
    actual.
    super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)pstore::repo::section_sparray<unsigned_long>::get_indices(this_01);
    std::begin<pstore::repo::section_sparray<unsigned_long>::indices>
              (&local_1d8,
               (indices *)
               &actual.
                super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::end<pstore::repo::section_sparray<unsigned_long>::indices>
              (&local_1f0,
               (indices *)
               &actual.
                super__Vector_base<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    paVar1 = (allocator<pstore::repo::section_kind> *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<pstore::repo::section_kind>::allocator(paVar1);
    __first.it_.pos_ = local_1d8.it_.pos_;
    __first.it_.bitmap_ = local_1d8.it_.bitmap_;
    __first.it_._4_4_ = local_1d8.it_._4_4_;
    __first.value_ = local_1d8.value_;
    __first._17_7_ = local_1d8._17_7_;
    __last.it_.pos_ = local_1f0.it_.pos_;
    __last.it_.bitmap_ = local_1f0.it_.bitmap_;
    __last.it_._4_4_ = local_1f0.it_._4_4_;
    __last.value_ = local_1f0.value_;
    __last._17_7_ = local_1f0._17_7_;
    std::vector<pstore::repo::section_kind,std::allocator<pstore::repo::section_kind>>::
    vector<pstore::repo::details::cast_iterator<pstore::repo::section_kind,pstore::sparse_array<unsigned_long,unsigned_int>::indices::const_iterator>,void>
              ((vector<pstore::repo::section_kind,std::allocator<pstore::repo::section_kind>> *)
               local_1c0,__first,__last,paVar1);
    std::allocator<pstore::repo::section_kind>::~allocator
              ((allocator<pstore::repo::section_kind> *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    testing::
    ContainerEq<std::vector<pstore::repo::section_kind,std::allocator<pstore::repo::section_kind>>>
              (&local_238,(testing *)local_190,rhs);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,std::allocator<pstore::repo::section_kind>>>>>
              (&local_220,(internal *)&local_238,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,std::allocator<pstore::repo::section_kind>>>>>
    ::operator()(local_208,(char *)&local_220,
                 (vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> *)
                 "actual");
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>_>_>_>
    ::~PredicateFormatterFromMatcher(&local_220);
    testing::
    PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>_>_>
    ::~PolymorphicMatcher(&local_238);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
    if (!bVar2) {
      testing::Message::Message(&local_240);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&s,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x72,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&s,&local_240);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s);
      testing::Message::~Message(&local_240);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pstore::repo::fragment::at<(pstore::repo::section_kind)11>(this_00);
    local_268[1] = 4;
    local_268[0] = pstore::repo::section_alignment<pstore::repo::generic_section>
                             ((generic_section *)
                              gtest_ar_2.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_260,"4U","section_alignment (s)",local_268 + 1,local_268);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar2) {
      testing::Message::Message(&local_270);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x76,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_270);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    local_28c = 6;
    local_298 = pstore::repo::section_size<pstore::repo::generic_section>
                          ((generic_section *)
                           gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_288,"6U","section_size (s)",&local_28c,&local_298);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar2) {
      testing::Message::Message(&local_2a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&data_begin,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x77,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&data_begin,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data_begin);
      testing::Message::~Message(&local_2a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    _data_end = pstore::repo::generic_section::payload
                          ((generic_section *)
                           gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    local_2b0 = std::begin<pstore::repo::container<unsigned_char>>
                          ((container<unsigned_char> *)&data_end);
    _rodata_begin =
         pstore::repo::generic_section::payload
                   ((generic_section *)
                    gtest_ar_2.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl);
    __last_00 = std::end<pstore::repo::container<unsigned_char>>
                          ((container<unsigned_char> *)&rodata_begin);
    __first_00 = std::begin<pstore::small_vector<unsigned_char,128ul>>(&local_f8->data);
    gtest_ar_4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::end<pstore::small_vector<unsigned_char,128ul>>(&local_f8->data);
    local_300 = std::distance<unsigned_char_const*>(local_2b0,__last_00);
    local_318.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )gtest_ar_4.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    local_310 = __first_00.pos_;
    local_308 = std::distance<pstore::pointer_based_iterator<unsigned_char>>
                          ((pointer_based_iterator<unsigned_char>)__first_00.pos_,
                           (pointer_based_iterator<unsigned_char>)
                           gtest_ar_4.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<long,_long,_nullptr>
              ((EqHelper *)local_2f8,"std::distance (data_begin, data_end)",
               "std::distance (rodata_begin, rodata_end)",&local_300,&local_308);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
    if (!bVar2) {
      testing::Message::Message(&local_320);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                 ,0x7d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_320);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_320);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
    if (bVar2) {
      local_348 = __first_00.pos_;
      local_339 = std::equal<unsigned_char_const*,pstore::pointer_based_iterator<unsigned_char>>
                            (local_2b0,__last_00,
                             (pointer_based_iterator<unsigned_char>)__first_00.pos_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_338,&local_339,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
      if (!bVar2) {
        testing::Message::Message(&local_350);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_5.message_,(internal *)local_338,
                   (AssertionResult *)"std::equal (data_begin, data_end, rodata_begin)","false",
                   "true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_358,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                   ,0x7e,pcVar5);
        testing::internal::AssertHelper::operator=(&local_358,&local_350);
        testing::internal::AssertHelper::~AssertHelper(&local_358);
        std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_350);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
      local_390[1] = 4;
      local_390[0] = pstore::repo::generic_section::align
                               ((generic_section *)
                                gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_388,"4U","s.align ()",local_390 + 1,local_390);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
      if (!bVar2) {
        testing::Message::Message(&local_398);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                   ,0x7f,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_398);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_398);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
      local_3b4 = 0;
      local_3d0 = pstore::repo::generic_section::ifixups
                            ((generic_section *)
                             gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
      local_3c0 = pstore::repo::container<pstore::repo::internal_fixup>::size(&local_3d0);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_3b0,"0U","s.ifixups ().size ()",&local_3b4,&local_3c0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
      if (!bVar2) {
        testing::Message::Message(&local_3d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                   ,0x80,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_3d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
      local_3f4 = 0;
      local_410 = pstore::repo::generic_section::xfixups
                            ((generic_section *)
                             gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
      local_400 = pstore::repo::container<pstore::repo::external_fixup>::size(&local_410);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_3f0,"0U","s.xfixups ().size ()",&local_3f4,&local_400);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
      if (!bVar2) {
        testing::Message::Message(&local_418);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                   ,0x81,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_418);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_418);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
      local_438 = pstore::repo::fragment::atp<(pstore::repo::section_kind)18>(this_00);
      local_440 = (void *)0x0;
      testing::internal::EqHelper::
      Compare<const_pstore::repo::linked_definitions_*,_std::nullptr_t,_nullptr>
                ((EqHelper *)local_430,"f->atp<section_kind::linked_definitions> ()","nullptr",
                 &local_438,&local_440);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
      if (!bVar2) {
        testing::Message::Message(&local_448);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
        testing::internal::AssertHelper::AssertHelper
                  (&local_450,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
                   ,0x82,pcVar5);
        testing::internal::AssertHelper::operator=(&local_450,&local_448);
        testing::internal::AssertHelper::~AssertHelper(&local_450);
        testing::Message::~Message(&local_448);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
    }
    std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>::~vector
              ((vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> *)
               local_1c0);
    std::vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_>::~vector
              ((vector<pstore::repo::section_kind,_std::allocator<pstore::repo::section_kind>_> *)
               local_190);
  }
  std::array<pstore::repo::section_content,_1UL>::~array
            ((array<pstore::repo::section_content,_1UL> *)&rodata);
  return;
}

Assistant:

TEST_F (FragmentTest, MakeReadOnlySection) {
    std::array<section_content, 1> c = {{{section_kind::read_only, std::uint8_t{4} /*alignment*/}}};
    section_content & rodata = c.back ();
    rodata.data.assign ({'r', 'o', 'd', 'a', 't', 'a'});
    auto extent = build_fragment (transaction_, std::begin (c), std::end (c));

    ASSERT_EQ (transaction_.get_storage ().begin ()->first,
               reinterpret_cast<std::uint8_t const *> (extent.addr.absolute ()));
    auto f = reinterpret_cast<fragment const *> (transaction_.get_storage ().begin ()->first);

    std::vector<section_kind> const expected{section_kind::read_only};
    auto const indices = f->members ().get_indices ();
    std::vector<section_kind> const actual{std::begin (indices), std::end (indices)};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));

    generic_section const & s = f->at<section_kind::read_only> ();

    EXPECT_EQ (4U, section_alignment (s));
    EXPECT_EQ (6U, section_size (s));

    auto data_begin = std::begin (s.payload ());
    auto data_end = std::end (s.payload ());
    auto rodata_begin = std::begin (rodata.data);
    auto rodata_end = std::end (rodata.data);
    ASSERT_EQ (std::distance (data_begin, data_end), std::distance (rodata_begin, rodata_end));
    EXPECT_TRUE (std::equal (data_begin, data_end, rodata_begin));
    EXPECT_EQ (4U, s.align ());
    EXPECT_EQ (0U, s.ifixups ().size ());
    EXPECT_EQ (0U, s.xfixups ().size ());
    EXPECT_EQ (f->atp<section_kind::linked_definitions> (), nullptr);
}